

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O0

void __thiscall
ServeStaticContent_MissingFile_Test::TestBody(ServeStaticContent_MissingFile_Test *this)

{
  bool bVar1;
  char *message;
  error_code eVar2;
  AssertHelper local_b0;
  Message local_a8;
  error_code local_a0;
  error_code local_90;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  ServeStaticContent_MissingFile_Test *this_local;
  
  actual._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"/foo.html",&local_59);
  anon_unknown.dwarf_a3877::ServeStaticContent::serve_path
            ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38,&this->super_ServeStaticContent,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  eVar2 = pstore::
          error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get_error((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_38);
  local_90._M_cat = eVar2._M_cat;
  local_90._M_value = eVar2._M_value;
  eVar2 = pstore::romfs::make_error_code(enoent);
  local_a0._M_cat = eVar2._M_cat;
  local_a0._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_80,"actual.get_error ()",
             "make_error_code (pstore::romfs::error_code::enoent)",&local_90,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  return;
}

Assistant:

TEST_F (ServeStaticContent, MissingFile) {
    pstore::error_or<std::string> const actual = serve_path ("/foo.html");
    EXPECT_EQ (actual.get_error (), make_error_code (pstore::romfs::error_code::enoent));
}